

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SmallVector<const_char_*,_8UL> * __thiscall
spirv_cross::SmallVector<const_char_*,_8UL>::operator=
          (SmallVector<const_char_*,_8UL> *this,SmallVector<const_char_*,_8UL> *other)

{
  char **ppcVar1;
  char **ppcVar2;
  ulong local_20;
  size_t i;
  SmallVector<const_char_*,_8UL> *other_local;
  SmallVector<const_char_*,_8UL> *this_local;
  
  clear(this);
  ppcVar1 = (other->super_VectorView<const_char_*>).ptr;
  ppcVar2 = AlignedBuffer<const_char_*,_8UL>::data(&other->stack_storage);
  if (ppcVar1 == ppcVar2) {
    reserve(this,(other->super_VectorView<const_char_*>).buffer_size);
    for (local_20 = 0; local_20 < (other->super_VectorView<const_char_*>).buffer_size;
        local_20 = local_20 + 1) {
      (this->super_VectorView<const_char_*>).ptr[local_20] =
           (other->super_VectorView<const_char_*>).ptr[local_20];
    }
    (this->super_VectorView<const_char_*>).buffer_size =
         (other->super_VectorView<const_char_*>).buffer_size;
    (other->super_VectorView<const_char_*>).buffer_size = 0;
  }
  else {
    ppcVar1 = (this->super_VectorView<const_char_*>).ptr;
    ppcVar2 = AlignedBuffer<const_char_*,_8UL>::data(&this->stack_storage);
    if (ppcVar1 != ppcVar2) {
      free((this->super_VectorView<const_char_*>).ptr);
    }
    (this->super_VectorView<const_char_*>).ptr = (other->super_VectorView<const_char_*>).ptr;
    (this->super_VectorView<const_char_*>).buffer_size =
         (other->super_VectorView<const_char_*>).buffer_size;
    this->buffer_capacity = other->buffer_capacity;
    (other->super_VectorView<const_char_*>).ptr = (char **)0x0;
    (other->super_VectorView<const_char_*>).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}